

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

int __thiscall
google::protobuf::Reflection::GetEnumValue(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  OneofDescriptor *pOVar4;
  int *piVar5;
  EnumValueDescriptor *pEVar6;
  char *description;
  Descriptor *pDVar7;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar7 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar7,MVar8.descriptor,field,"GetEnumValue");
  }
  pDVar7 = this->descriptor_;
  if (field->containing_type_ == pDVar7) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (!bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"GetEnumValue",CPPTYPE_ENUM);
      }
      if ((field->field_0x1 & 8) == 0) {
        pOVar4 = FieldDescriptor::real_containing_oneof(field);
        if ((pOVar4 != (OneofDescriptor *)0x0) &&
           (bVar1 = HasOneofField(this,message,field), !bVar1)) {
          pEVar6 = FieldDescriptor::default_value_enum(field);
          return pEVar6->number_;
        }
        piVar5 = GetRaw<int>(this,message,field);
        return *piVar5;
      }
      uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      iVar3 = field->number_;
      pEVar6 = FieldDescriptor::default_value_enum(field);
      iVar3 = internal::ExtensionSet::GetEnum
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                         iVar3,pEVar6->number_);
      return iVar3;
    }
    pDVar7 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar7,field,"GetEnumValue",description);
}

Assistant:

int Reflection::GetEnumValue(const Message& message,
                             const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnumValue, SINGULAR, ENUM);

  int32_t value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
        field->number(), field->default_value_enum()->number());
  } else if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
    value = field->default_value_enum()->number();
  } else {
    value = GetField<int>(message, field);
  }
  return value;
}